

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  ostream *poVar3;
  Status SVar4;
  string sStack_1d8;
  mode_t perm;
  Status copy_status;
  WhichPath local_1a8;
  mode_t permissions;
  
  if (this->Always == false) {
    bVar2 = cmFileTimeCache::DifferS(&this->FileTimes,fromFile,toFile);
    (*this->_vptr_cmFileCopier[5])(this,toFile,0,(ulong)bVar2);
    if (!bVar2) goto LAB_004c2a2a;
  }
  else {
    (*this->_vptr_cmFileCopier[5])(this,toFile,0,1);
  }
  _copy_status = cmsys::SystemTools::CopyAFile(fromFile,toFile,true);
  if (copy_status.Kind_ == Success) {
    if (this->Always == false) {
      perm = 0;
      SVar4 = cmsys::SystemTools::GetPermissions(toFile,&perm);
      if (SVar4.Kind_ == Success) {
        cmsys::SystemTools::SetPermissions(toFile,perm | 0x80,false);
      }
      SVar4 = cmFileTimes::Copy(fromFile,toFile);
      copy_status = SVar4;
      if (SVar4.Kind_ != Success) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&permissions);
        poVar3 = std::operator<<((ostream *)&permissions,this->Name);
        poVar3 = std::operator<<(poVar3," cannot set modification time on \"");
        poVar3 = std::operator<<(poVar3,(string *)toFile);
        poVar3 = std::operator<<(poVar3,"\": ");
        cmsys::Status::GetString_abi_cxx11_(&sStack_1d8,&copy_status);
        poVar3 = std::operator<<(poVar3,(string *)&sStack_1d8);
        std::operator<<(poVar3,".");
        std::__cxx11::string::~string((string *)&sStack_1d8);
        pcVar1 = this->Status;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
        goto LAB_004c292f;
      }
    }
LAB_004c2a2a:
    permissions = match_properties.Permissions;
    if ((ulong)match_properties >> 0x20 == 0) {
      permissions = this->FilePermissions;
    }
    if (permissions == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,&permissions);
    }
    bVar2 = SetPermissions(this,toFile,permissions);
    return bVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&permissions);
  poVar3 = std::operator<<((ostream *)&permissions,this->Name);
  poVar3 = std::operator<<(poVar3," cannot copy file \"");
  poVar3 = std::operator<<(poVar3,(string *)fromFile);
  poVar3 = std::operator<<(poVar3,"\" to \"");
  poVar3 = std::operator<<(poVar3,(string *)toFile);
  poVar3 = std::operator<<(poVar3,"\": ");
  cmsys::Status::GetString_abi_cxx11_(&sStack_1d8,&copy_status);
  poVar3 = std::operator<<(poVar3,(string *)&sStack_1d8);
  std::operator<<(poVar3,".");
  std::__cxx11::string::~string((string *)&sStack_1d8);
  pcVar1 = this->Status;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
LAB_004c292f:
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&permissions);
  return false;
}

Assistant:

bool cmFileCopier::InstallFile(const std::string& fromFile,
                               const std::string& toFile,
                               MatchProperties match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if (!this->Always) {
    // If both files exist with the same time do not copy.
    if (!this->FileTimes.DifferS(fromFile, toFile)) {
      copy = false;
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if (copy) {
    auto copy_status = cmSystemTools::CopyAFile(fromFile, toFile, true);
    if (!copy_status) {
      std::ostringstream e;
      e << this->Name << " cannot copy file \"" << fromFile << "\" to \""
        << toFile << "\": " << copy_status.GetString() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }

  // Set the file modification time of the destination file.
  if (copy && !this->Always) {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if (cmSystemTools::GetPermissions(toFile, perm)) {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
    }
    auto copy_status = cmFileTimes::Copy(fromFile, toFile);
    if (!copy_status) {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \"" << toFile
        << "\": " << copy_status.GetString() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }

  // Set permissions of the destination file.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->FilePermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
  }
  return this->SetPermissions(toFile, permissions);
}